

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImVec2 IVar1;
  ImGuiID IVar2;
  int iVar3;
  ImGuiWindow *window;
  ImGuiWindow *pIVar4;
  bool bVar5;
  uint uVar6;
  bool bVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  char cVar12;
  long lVar13;
  uint uVar14;
  ImGuiContext *g;
  bool bVar15;
  ImVec2 IVar16;
  
  pIVar8 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  bVar15 = (flags & 7U) == 0;
  uVar6 = (uint)bVar15 + flags + 0x20;
  if ((flags & 0x3f0U) != 0) {
    uVar6 = (uint)bVar15 | flags;
  }
  pIVar4 = pIVar8->HoveredWindow;
  if ((pIVar4 == (ImGuiWindow *)0x0 || (uVar6 >> 0xb & 1) == 0) || (pIVar4->RootWindow != window)) {
    bVar15 = false;
  }
  else {
    pIVar8->HoveredWindow = window;
    bVar15 = true;
  }
  bVar9 = ItemHoverable(bb,id);
  if (bVar9) {
    bVar9 = true;
    if (((pIVar8->DragDropActive & 1U) != 0) && ((pIVar8->DragDropPayload).SourceId == id)) {
      bVar9 = (bool)(((byte)pIVar8->DragDropSourceFlags & 2) >> 1);
    }
  }
  else {
    bVar9 = false;
  }
  if (((uVar6 >> 9 & 1) == 0 || (~pIVar8->DragDropActive & 1U) != 0) ||
     ((pIVar8->DragDropSourceFlags & 4) != 0)) {
    bVar10 = false;
  }
  else {
    bVar10 = IsItemHovered(0x80);
    if (bVar10) {
      SetHoveredID(id);
      bVar10 = false;
      bVar9 = true;
      if (0.7 <= pIVar8->HoveredIdTimer) {
        if (pIVar8->HoveredIdTimer - (pIVar8->IO).DeltaTime <= 0.7) {
          pIVar8->DragDropHoldJustPressedId = id;
          FocusWindow(window);
          bVar9 = true;
          bVar10 = true;
        }
        goto LAB_0014d650;
      }
    }
    bVar10 = false;
  }
LAB_0014d650:
  if (bVar15) {
    pIVar8->HoveredWindow = pIVar4;
  }
  if (bVar9 == true && (uVar6 >> 0xc & 1) != 0) {
    bVar9 = pIVar8->HoveredIdPreviousFrame == 0 || pIVar8->HoveredIdPreviousFrame == id;
  }
  if (bVar9 == false) {
    bVar15 = false;
  }
  else {
    if (((uVar6 >> 0x10 & 1) == 0) ||
       ((((pIVar8->IO).KeyCtrl == false && ((pIVar8->IO).KeyShift == false)) &&
        ((pIVar8->IO).KeyAlt == false)))) {
      if ((uVar6 & 1) == 0) {
LAB_0014d6af:
        if (((uVar6 & 2) == 0) || ((pIVar8->IO).MouseClicked[1] == false)) {
          if ((uVar6 & 4) == 0) {
            uVar14 = 0xffffffff;
            bVar11 = 1;
          }
          else {
            bVar11 = (pIVar8->IO).MouseClicked[2] ^ 1;
            uVar14 = -(uint)bVar11 | 2;
          }
        }
        else {
          bVar11 = 0;
          uVar14 = 1;
        }
        if ((uVar6 & 1) != 0) goto LAB_0014d73a;
LAB_0014d74f:
        if (((uVar6 & 2) == 0) || ((pIVar8->IO).MouseReleased[1] == false)) {
          lVar13 = 0xffffffff;
          if ((uVar6 & 4) == 0) {
            cVar12 = '\0';
          }
          else {
            cVar12 = (pIVar8->IO).MouseReleased[2];
            if ((bool)cVar12 != false) {
              lVar13 = 2;
            }
          }
        }
        else {
          cVar12 = '\x01';
          lVar13 = 1;
        }
      }
      else {
        uVar14 = 0;
        bVar11 = 0;
        if ((pIVar8->IO).MouseClicked[0] == false) goto LAB_0014d6af;
LAB_0014d73a:
        if ((pIVar8->IO).MouseReleased[0] == false) goto LAB_0014d74f;
        cVar12 = '\x01';
        lVar13 = 0;
      }
      if ((bVar11 == 0) && (pIVar8->ActiveId != id)) {
        if ((uVar6 & 0x60) != 0) {
          SetActiveID(id,window);
          pIVar8->ActiveIdMouseButton = uVar14;
          if ((uVar6 >> 0x12 & 1) == 0) {
            SetFocusID(id,window);
          }
          FocusWindow(window);
        }
        if (((uVar6 & 0x10) != 0) ||
           (((uVar6 >> 8 & 1) != 0 && ((pIVar8->IO).MouseClickedCount[uVar14] == 2)))) {
          if ((uVar6 >> 0x11 & 1) == 0) {
            SetActiveID(id,window);
          }
          else {
            ClearActiveID();
          }
          if ((uVar6 >> 0x12 & 1) == 0) {
            SetFocusID(id,window);
          }
          pIVar8->ActiveIdMouseButton = uVar14;
          FocusWindow(window);
          bVar10 = true;
        }
      }
      if (((char)(byte)uVar6 < '\0') && (cVar12 != '\0')) {
        bVar15 = true;
        if (((uVar6 >> 10 & 1) != 0) &&
           (bVar15 = bVar10,
           (pIVar8->IO).MouseDownDurationPrev[lVar13] < (pIVar8->IO).KeyRepeatDelay)) {
          bVar15 = true;
        }
        if ((uVar6 >> 0x12 & 1) == 0) {
          SetFocusID(id,window);
        }
        ClearActiveID();
        bVar10 = bVar15;
      }
      if (((((uVar6 >> 10 & 1) != 0) && (pIVar8->ActiveId == id)) &&
          (0.0 < (pIVar8->IO).MouseDownDuration[pIVar8->ActiveIdMouseButton])) &&
         (bVar15 = IsMouseClicked(pIVar8->ActiveIdMouseButton,true), bVar15)) {
        bVar10 = true;
      }
    }
    bVar15 = true;
    if (bVar10) {
      pIVar8->NavDisableHighlight = true;
    }
  }
  if (((pIVar8->NavId == id) && (pIVar8->NavDisableHighlight == false)) &&
     (pIVar8->NavDisableMouseHover == true)) {
    IVar2 = pIVar8->ActiveId;
    if (IVar2 == id || IVar2 == 0) {
      if ((uVar6 >> 0x13 & 1) == 0) {
LAB_0014d91f:
        bVar15 = true;
      }
    }
    else if (((uVar6 >> 0x13 & 1) == 0) && (IVar2 == window->MoveId)) goto LAB_0014d91f;
  }
  if ((pIVar8->NavActivateDownId == id) &&
     ((IVar2 = pIVar8->NavActivateId,
      bVar9 = IsNavInputTest(0,(uVar6 >> 9 & 2) + ImGuiInputReadMode_Pressed), IVar2 == id ||
      (bVar9)))) {
    SetActiveID(id,window);
    pIVar8->ActiveIdSource = ImGuiInputSource_Nav;
    if ((uVar6 >> 0x12 & 1) == 0) {
      SetFocusID(id,window);
    }
    bVar10 = true;
  }
  if (pIVar8->ActiveId != id) {
    bVar9 = false;
    goto LAB_0014da9f;
  }
  if (pIVar8->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar8->NavActivateDownId != id) {
      ClearActiveID();
    }
LAB_0014da06:
    bVar9 = false;
  }
  else {
    if (pIVar8->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_0014da06;
    if (pIVar8->ActiveIdIsJustActivated == true) {
      IVar1 = (pIVar8->IO).MousePos;
      IVar16.x = IVar1.x - (bb->Min).x;
      IVar16.y = IVar1.y - (bb->Min).y;
      pIVar8->ActiveIdClickOffset = IVar16;
    }
    iVar3 = pIVar8->ActiveIdMouseButton;
    bVar9 = true;
    if ((pIVar8->IO).MouseDown[iVar3] == false) {
      bVar7 = bVar10;
      if ((((uVar6 & 0x40) != 0) || (((byte)uVar6 >> 5 & bVar15) != 0)) &&
         (pIVar8->DragDropActive == false)) {
        if (((uVar6 >> 8 & 1) == 0) || ((pIVar8->IO).MouseReleased[iVar3] != true)) {
          bVar9 = false;
        }
        else {
          bVar9 = (pIVar8->IO).MouseClickedLastCount[iVar3] == 2;
        }
        if ((uVar6 >> 10 & 1) == 0) {
          bVar5 = false;
        }
        else {
          bVar5 = (pIVar8->IO).KeyRepeatDelay <= (pIVar8->IO).MouseDownDurationPrev[iVar3];
        }
        if ((!bVar9) && (bVar7 = true, bVar5)) {
          bVar7 = bVar10;
        }
      }
      ClearActiveID();
      bVar9 = false;
      bVar10 = bVar7;
    }
    if ((uVar6 >> 0x12 & 1) == 0) {
      pIVar8->NavDisableHighlight = true;
    }
  }
  if (bVar10 != false) {
    pIVar8->ActiveIdHasBeenPressedBefore = true;
  }
LAB_0014da9f:
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar15;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar9;
  }
  return bVar10;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredWindow && g.HoveredWindow->RootWindow == window;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && g.LastItemData.ID != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (g.HoveredIdTimer - g.IO.DeltaTime <= DRAGDROP_HOLD_TO_OPEN_TIMER && g.HoveredIdTimer >= DRAGDROP_HOLD_TO_OPEN_TIMER)
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            int mouse_button_released = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseClicked[0])         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseClicked[1])   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseClicked[2])  { mouse_button_clicked = 2; }
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseReleased[0])        { mouse_button_released = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseReleased[1])  { mouse_button_released = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseReleased[2]) { mouse_button_released = 2; }

            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseClickedCount[mouse_button_clicked] == 2))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && mouse_button_released != -1)
            {
                // Repeat mode trumps on release behavior
                const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay;
                if (!has_repeated_at_least_once)
                    pressed = true;
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, true))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            pressed = true;
            SetActiveID(id, window);
            g.ActiveIdSource = ImGuiInputSource_Nav;
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
            if (g.IO.MouseDown[mouse_button])
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseReleased[mouse_button] && g.IO.MouseClickedLastCount[mouse_button] == 2;
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}